

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::SerializeWithCachedSizes
          (ResizeBilinearLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  uint64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ResizeBilinearLayerParams *this_local;
  
  iVar2 = targetsize_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_targetsize_cached_byte_size_);
  }
  local_20 = 0;
  iVar2 = targetsize_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value = targetsize(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  bVar1 = has_mode(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->mode_->super_MessageLite,output);
  }
  return;
}

Assistant:

void ResizeBilinearLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ResizeBilinearLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  if (this->targetsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_targetsize_cached_byte_size_);
  }
  for (int i = 0, n = this->targetsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->targetsize(i), output);
  }

  // .CoreML.Specification.SamplingMode mode = 2;
  if (this->has_mode()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->mode_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ResizeBilinearLayerParams)
}